

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuMatrix.hpp
# Opt level: O1

Matrix<float,_4,_3> *
tcu::operator-(Matrix<float,_4,_3> *__return_storage_ptr__,Matrix<float,_4,_3> *mtx,float scalar)

{
  Vector<float,_4> *pVVar1;
  Matrix<float,_4,_3> *pMVar2;
  int col;
  long lVar3;
  int row_1;
  float *pfVar4;
  Matrix<float,_4,_3> *res;
  int row;
  long lVar5;
  long lVar6;
  undefined4 uVar7;
  
  pMVar2 = __return_storage_ptr__;
  (__return_storage_ptr__->m_data).m_data[2].m_data[0] = 0.0;
  (__return_storage_ptr__->m_data).m_data[2].m_data[1] = 0.0;
  pVVar1 = (__return_storage_ptr__->m_data).m_data;
  pVVar1[2].m_data[2] = 0.0;
  pVVar1[2].m_data[3] = 0.0;
  (__return_storage_ptr__->m_data).m_data[1].m_data[0] = 0.0;
  (__return_storage_ptr__->m_data).m_data[1].m_data[1] = 0.0;
  pVVar1 = (__return_storage_ptr__->m_data).m_data;
  pVVar1[1].m_data[2] = 0.0;
  pVVar1[1].m_data[3] = 0.0;
  (__return_storage_ptr__->m_data).m_data[0].m_data[0] = 0.0;
  (__return_storage_ptr__->m_data).m_data[0].m_data[1] = 0.0;
  (__return_storage_ptr__->m_data).m_data[0].m_data[2] = 0.0;
  (__return_storage_ptr__->m_data).m_data[0].m_data[3] = 0.0;
  lVar3 = 0;
  lVar5 = 0;
  pfVar4 = (float *)__return_storage_ptr__;
  do {
    lVar6 = 0;
    do {
      uVar7 = 0x3f800000;
      if (lVar3 != lVar6) {
        uVar7 = 0;
      }
      *(undefined4 *)((long)pfVar4 + lVar6) = uVar7;
      lVar6 = lVar6 + 0x10;
    } while (lVar6 != 0x30);
    lVar5 = lVar5 + 1;
    pfVar4 = pfVar4 + 1;
    lVar3 = lVar3 + 0x10;
  } while (lVar5 != 4);
  lVar3 = 0;
  do {
    lVar5 = 0;
    do {
      ((Vector<tcu::Vector<float,_4>,_3> *)((Vector<float,_4> *)__return_storage_ptr__)->m_data)->
      m_data[0].m_data[lVar5] =
           ((Vector<tcu::Vector<float,_4>,_3> *)((Vector<float,_4> *)mtx)->m_data)->m_data[0].m_data
           [lVar5] - scalar;
      lVar5 = lVar5 + 1;
    } while (lVar5 != 4);
    lVar3 = lVar3 + 1;
    __return_storage_ptr__ = (Matrix<float,_4,_3> *)((long)__return_storage_ptr__ + 0x10);
    mtx = (Matrix<float,_4,_3> *)((long)mtx + 0x10);
  } while (lVar3 != 3);
  return pMVar2;
}

Assistant:

Matrix<T, Rows, Cols> operator- (const Matrix<T, Rows, Cols>& mtx, T scalar)
{
	Matrix<T, Rows, Cols> res;
	for (int col = 0; col < Cols; col++)
		for (int row = 0; row < Rows; row++)
			res(row, col) = mtx(row, col) - scalar;
	return res;
}